

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setAttribute(QWidget *this,WidgetAttribute attribute,bool on)

{
  bool bVar1;
  QWidgetPrivate *d_00;
  QTLWExtra *pQVar2;
  QPlatformIntegration *pQVar3;
  ulong uVar4;
  long lVar5;
  qsizetype qVar6;
  WId WVar7;
  QWidget *pQVar8;
  QFlags_conflict1 *pQVar9;
  QFlags<Qt::InputMethodQuery> *this_00;
  QWidgetRepaintManager *pQVar10;
  QWidgetPrivate *this_01;
  undefined1 in_DL;
  WidgetAttribute in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidgetRepaintManager *repaintManager;
  QWidget *focusWidget;
  QWidget *w;
  int i;
  QPlatformIntegration *platformIntegration;
  QTLWExtra *topExtra;
  QWidgetPrivate *d;
  QEvent e_2;
  QEvent e_1;
  QEvent e;
  undefined4 in_stack_ffffffffffffff38;
  InputMethodQuery in_stack_ffffffffffffff3c;
  QWidgetPrivate *in_stack_ffffffffffffff40;
  WidgetAttribute WVar11;
  QWidgetPrivate *in_stack_ffffffffffffff48;
  QWidgetPrivate *in_stack_ffffffffffffff50;
  QWidgetPrivate *in_stack_ffffffffffffff58;
  QWidgetPrivate *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar12;
  undefined3 in_stack_ffffffffffffffa8;
  uint uVar13;
  byte bVar14;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar13 = CONCAT13(in_DL,in_stack_ffffffffffffffa8) & 0x1ffffff;
  d_00 = d_func((QWidget *)0x35c39c);
  if ((in_ESI == WA_ContentsMarginsRespectsSafeArea) &&
     (bVar1 = isWindow((QWidget *)in_stack_ffffffffffffff40), bVar1)) {
    pQVar2 = QWidgetPrivate::topData(in_stack_ffffffffffffff40);
    *(ushort *)&pQVar2->field_0xe0 = *(ushort *)&pQVar2->field_0xe0 & 0xf7ff | 0x800;
  }
  bVar1 = testAttribute((QWidget *)in_stack_ffffffffffffff48,
                        (WidgetAttribute)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  if (bVar1 == (bool)((byte)(uVar13 >> 0x18) & 1)) goto LAB_0035ca91;
  if ((in_ESI == WA_NativeWindow) && ((*(uint *)&d_00->field_0x250 >> 0x17 & 1) == 0)) {
    pQVar3 = QGuiApplicationPrivate::platformIntegration();
    uVar4 = (**(code **)(*(long *)pQVar3 + 0x10))(pQVar3,0xb);
    if ((uVar4 & 1) == 0) goto LAB_0035ca91;
  }
  setAttribute_internal(in_ESI,(bool)((byte)(uVar13 >> 0x18) & 1),in_RDI->data,d_00);
  this_01 = (QWidgetPrivate *)(ulong)(in_ESI - WA_MouseTracking);
  bVar14 = (byte)(uVar13 >> 0x18);
  WVar11 = (WidgetAttribute)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  switch(this_01) {
  case (QWidgetPrivate *)0x0:
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_28,MouseTrackingChange);
    QCoreApplication::sendEvent(&in_RDI->super_QObject,(QEvent *)&local_28);
    QEvent::~QEvent((QEvent *)&local_28);
    break;
  default:
    break;
  case (QWidgetPrivate *)0x3:
    pQVar10 = QWidgetPrivate::maybeRepaintManager(in_stack_ffffffffffffff50);
    if (pQVar10 != (QWidgetRepaintManager *)0x0) {
      if ((uVar13 & 0x1000000) == 0) {
        QWidgetRepaintManager::removeStaticWidget
                  ((QWidgetRepaintManager *)0x35ca62,
                   (QWidget *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
      else {
        QWidgetRepaintManager::addStaticWidget
                  ((QWidgetRepaintManager *)in_stack_ffffffffffffff40,
                   (QWidget *)in_stack_ffffffffffffff48);
      }
    }
    break;
  case (QWidgetPrivate *)0x6:
    QWidgetPrivate::updateIsOpaque(this_01);
  case (QWidgetPrivate *)0x2:
    QWidgetPrivate::updateIsOpaque(this_01);
    break;
  case (QWidgetPrivate *)0x7:
    QWidgetPrivate::updateIsOpaque(this_01);
  case (QWidgetPrivate *)0x8:
    QWidgetPrivate::updateSystemBackground(d_00);
    break;
  case (QWidgetPrivate *)0xc:
    pQVar8 = (QWidget *)QGuiApplication::focusObject();
    if (pQVar8 == in_RDI) {
      if ((uVar13 & 0x1000000) == 0) {
        QGuiApplication::inputMethod();
        QInputMethod::commit();
      }
      this_00 = (QFlags<Qt::InputMethodQuery> *)QGuiApplication::inputMethod();
      QFlags<Qt::InputMethodQuery>::QFlags(this_00,in_stack_ffffffffffffff3c);
      QInputMethod::update((QFlags_conflict1 *)this_00);
    }
    break;
  case (QWidgetPrivate *)0x25:
    *(uint *)&d_00->field_0x30 =
         *(uint *)&d_00->field_0x30 & 0xffffffdf | (uint)((bVar14 ^ 0xff) & 1) << 5;
    break;
  case (QWidgetPrivate *)0x31:
    break;
  case (QWidgetPrivate *)0x38:
    *(uint *)&d_00->field_0x30 =
         *(uint *)&d_00->field_0x30 & 0xffffffef | (uint)((bVar14 ^ 0xff) & 1) << 4;
    break;
  case (QWidgetPrivate *)0x44:
    if ((uVar13 & 0x1000000) == 0) {
      *(uint *)&in_RDI->data->field_0x10 = *(uint *)&in_RDI->data->field_0x10 & 0xfffcffff;
    }
    else if ((*(uint *)&in_RDI->data->field_0x10 >> 0x10 & 3) == 0) {
      *(uint *)&in_RDI->data->field_0x10 = *(uint *)&in_RDI->data->field_0x10 & 0xfffcffff | 0x20000
      ;
    }
    bVar1 = testAttribute((QWidget *)in_stack_ffffffffffffff48,WVar11);
    if (bVar1) {
      QWidgetPrivate::setModal_sys(in_stack_ffffffffffffff40);
    }
    break;
  case (QWidgetPrivate *)0x4c:
    if (((uVar13 & 0x1000000) == 0) ||
       (bVar1 = testAttribute((QWidget *)in_stack_ffffffffffffff48,WVar11), bVar1)) {
      if ((uVar13 & 0x1000000) == 0) {
        bVar1 = isWindow((QWidget *)in_stack_ffffffffffffff40);
        WVar11 = (WidgetAttribute)((ulong)in_stack_ffffffffffffff40 >> 0x20);
        if ((!bVar1) && (pQVar8 = parentWidget((QWidget *)0x35c4ec), pQVar8 != (QWidget *)0x0)) {
          parentWidget((QWidget *)0x35c4fc);
          bVar1 = testAttribute((QWidget *)in_stack_ffffffffffffff48,WVar11);
          if (bVar1) goto LAB_0035c520;
        }
        setAttribute((QWidget *)CONCAT44(in_ESI,uVar13),(WidgetAttribute)((ulong)d_00 >> 0x20),
                     SUB81((ulong)d_00 >> 0x18,0));
      }
    }
    else {
      setAttribute((QWidget *)CONCAT44(in_ESI,uVar13),(WidgetAttribute)((ulong)d_00 >> 0x20),
                   SUB81((ulong)d_00 >> 0x18,0));
    }
LAB_0035c520:
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_18,AcceptDropsChange);
    QCoreApplication::sendEvent(&in_RDI->super_QObject,(QEvent *)&local_18);
    QEvent::~QEvent((QEvent *)&local_18);
    break;
  case (QWidgetPrivate *)0x4d:
    iVar12 = 0;
    while( true ) {
      lVar5 = (long)iVar12;
      qVar6 = QList<QObject_*>::size((QList<QObject_*> *)&d_00->field_0x18);
      if (qVar6 <= lVar5) break;
      QList<QObject_*>::at
                ((QList<QObject_*> *)in_stack_ffffffffffffff40,
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      pQVar8 = qobject_cast<QWidget*>
                         ((QObject *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (((pQVar8 != (QWidget *)0x0) &&
          (bVar1 = isWindow((QWidget *)in_stack_ffffffffffffff40), !bVar1)) &&
         ((bVar1 = testAttribute((QWidget *)in_stack_ffffffffffffff48,
                                 (WidgetAttribute)((ulong)in_stack_ffffffffffffff40 >> 0x20)),
          !bVar1 && (bVar1 = testAttribute((QWidget *)in_stack_ffffffffffffff48,
                                           (WidgetAttribute)
                                           ((ulong)in_stack_ffffffffffffff40 >> 0x20)),
                    bVar1 != (bool)((byte)(uVar13 >> 0x18) & 1))))) {
        setAttribute((QWidget *)CONCAT44(in_ESI,uVar13),(WidgetAttribute)((ulong)d_00 >> 0x20),
                     SUB81((ulong)d_00 >> 0x18,0));
      }
      iVar12 = iVar12 + 1;
    }
    break;
  case (QWidgetPrivate *)0x4e:
    QWidgetPrivate::resolvePalette(in_stack_ffffffffffffff48);
    QWidgetPrivate::resolveFont(in_stack_ffffffffffffff58);
    QWidgetPrivate::resolveLocale(in_stack_ffffffffffffff50);
    break;
  case (QWidgetPrivate *)0x57:
  case (QWidgetPrivate *)0x58:
  case (QWidgetPrivate *)0x59:
    break;
  case (QWidgetPrivate *)0x62:
    QWidgetPrivate::createTLExtra(in_stack_ffffffffffffff48);
    if ((uVar13 & 0x1000000) != 0) {
      QWidgetPrivate::createTLSysExtra
                ((QWidgetPrivate *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    QWidgetPrivate::effectiveFocusWidget(in_stack_ffffffffffffff40);
    if (((((uVar13 & 0x1000000) != 0) && (WVar7 = internalWinId(in_RDI), WVar7 == 0)) &&
        (pQVar8 = (QWidget *)QGuiApplication::focusObject(), in_RDI == pQVar8)) &&
       (bVar1 = testAttribute((QWidget *)in_stack_ffffffffffffff48,
                              (WidgetAttribute)((ulong)in_stack_ffffffffffffff40 >> 0x20)), bVar1))
    {
      QGuiApplication::inputMethod();
      QInputMethod::commit();
      in_stack_ffffffffffffff50 = (QWidgetPrivate *)QGuiApplication::inputMethod();
      QFlags<Qt::InputMethodQuery>::QFlags
                ((QFlags<Qt::InputMethodQuery> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c
                );
      QInputMethod::update((QFlags_conflict1 *)in_stack_ffffffffffffff50);
    }
    uVar4 = QCoreApplication::testAttribute(AA_DontCreateNativeWidgetSiblings);
    if (((uVar4 & 1) == 0) && (pQVar8 = parentWidget((QWidget *)0x35c86b), pQVar8 != (QWidget *)0x0)
       ) {
      parentWidget((QWidget *)0x35c87b);
      d_func((QWidget *)0x35c883);
      QWidgetPrivate::enforceNativeChildren(in_stack_ffffffffffffff50);
    }
    if ((((uVar13 & 0x1000000) != 0) && (WVar7 = internalWinId(in_RDI), WVar7 == 0)) &&
       (bVar1 = testAttribute((QWidget *)in_stack_ffffffffffffff48,
                              (WidgetAttribute)((ulong)in_stack_ffffffffffffff40 >> 0x20)), bVar1))
    {
      QWidgetPrivate::createWinId(in_stack_ffffffffffffff70);
    }
    bVar1 = isEnabled((QWidget *)0x35c8cb);
    if ((((bVar1) && (bVar1 = isEnabled((QWidget *)0x35c8db), bVar1)) &&
        (pQVar8 = (QWidget *)QGuiApplication::focusObject(), in_RDI == pQVar8)) &&
       (bVar1 = testAttribute((QWidget *)in_stack_ffffffffffffff48,
                              (WidgetAttribute)((ulong)in_stack_ffffffffffffff40 >> 0x20)), bVar1))
    {
      pQVar9 = (QFlags_conflict1 *)QGuiApplication::inputMethod();
      QFlags<Qt::InputMethodQuery>::QFlags
                ((QFlags<Qt::InputMethodQuery> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c
                );
      QInputMethod::update(pQVar9);
    }
    break;
  case (QWidgetPrivate *)0x65:
    if (((uVar13 & 0x1000000) != 0) && (bVar1 = isVisible((QWidget *)0x35c9fa), bVar1)) {
      QWidgetPrivate::hide_sys(in_stack_ffffffffffffff58);
      QWidgetPrivate::show_sys
                ((QWidgetPrivate *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    break;
  case (QWidgetPrivate *)0x66:
  case (QWidgetPrivate *)0x67:
  case (QWidgetPrivate *)0x68:
  case (QWidgetPrivate *)0x69:
  case (QWidgetPrivate *)0x6a:
  case (QWidgetPrivate *)0x6b:
  case (QWidgetPrivate *)0x6c:
  case (QWidgetPrivate *)0x6d:
  case (QWidgetPrivate *)0x6e:
  case (QWidgetPrivate *)0x6f:
  case (QWidgetPrivate *)0x70:
  case (QWidgetPrivate *)0x71:
  case (QWidgetPrivate *)0x72:
    QWidgetPrivate::setNetWmWindowTypes
              (in_stack_ffffffffffffff58,SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0));
    break;
  case (QWidgetPrivate *)0x76:
    if ((uVar13 & 0x1000000) != 0) {
      setAttribute((QWidget *)CONCAT44(in_ESI,uVar13),(WidgetAttribute)((ulong)d_00 >> 0x20),
                   SUB81((ulong)d_00 >> 0x18,0));
    }
    QWidgetPrivate::updateIsTranslucent(in_stack_ffffffffffffff50);
    break;
  case (QWidgetPrivate *)0x77:
    break;
  case (QWidgetPrivate *)0x7f:
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_38,TabletTrackingChange);
    QCoreApplication::sendEvent(&in_RDI->super_QObject,(QEvent *)&local_38);
    QEvent::~QEvent((QEvent *)&local_38);
  }
LAB_0035ca91:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setAttribute(Qt::WidgetAttribute attribute, bool on)
{
    Q_D(QWidget);

    if (attribute == Qt::WA_ContentsMarginsRespectsSafeArea) {
        if (isWindow()) {
            auto *topExtra = d->topData();
            topExtra->explicitContentsMarginsRespectsSafeArea = true;
        }
    }

    if (testAttribute(attribute) == on)
        return;

    static_assert(sizeof(d->high_attributes)*8 >= (Qt::WA_AttributeCount - sizeof(uint)*8),
                      "QWidget::setAttribute(WidgetAttribute, bool): "
                      "QWidgetPrivate::high_attributes[] too small to contain all attributes in WidgetAttribute");
#ifdef Q_OS_WIN
    // ### Don't use PaintOnScreen+paintEngine() to do native painting in some future release
    if (attribute == Qt::WA_PaintOnScreen && on && windowType() != Qt::Desktop && !inherits("QGLWidget")) {
        // see ::paintEngine for details
        paintEngine();
        if (d->noPaintOnScreen)
            return;
    }
#endif

    // Don't set WA_NativeWindow on platforms that don't support it -- except for QGLWidget, which depends on it
    if (attribute == Qt::WA_NativeWindow && !d->mustHaveWindowHandle) {
        QPlatformIntegration *platformIntegration = QGuiApplicationPrivate::platformIntegration();
        if (!platformIntegration->hasCapability(QPlatformIntegration::NativeWidgets))
            return;
    }

    setAttribute_internal(attribute, on, data, d);

    switch (attribute) {

#if QT_CONFIG(draganddrop)
    case Qt::WA_AcceptDrops:  {
        if (on && !testAttribute(Qt::WA_DropSiteRegistered))
            setAttribute(Qt::WA_DropSiteRegistered, true);
        else if (!on && (isWindow() || !parentWidget() || !parentWidget()->testAttribute(Qt::WA_DropSiteRegistered)))
            setAttribute(Qt::WA_DropSiteRegistered, false);
        QEvent e(QEvent::AcceptDropsChange);
        QCoreApplication::sendEvent(this, &e);
        break;
    }
    case Qt::WA_DropSiteRegistered:  {
        for (int i = 0; i < d->children.size(); ++i) {
            QWidget *w = qobject_cast<QWidget *>(d->children.at(i));
            if (w && !w->isWindow() && !w->testAttribute(Qt::WA_AcceptDrops) && w->testAttribute(Qt::WA_DropSiteRegistered) != on)
                w->setAttribute(Qt::WA_DropSiteRegistered, on);
        }
        break;
    }
#endif

    case Qt::WA_NoChildEventsForParent:
        d->sendChildEvents = !on;
        break;
    case Qt::WA_NoChildEventsFromChildren:
        d->receiveChildEvents = !on;
        break;
    case Qt::WA_MacNormalSize:
    case Qt::WA_MacSmallSize:
    case Qt::WA_MacMiniSize:
#ifdef Q_OS_MAC
        {
            // We can only have one of these set at a time
            const Qt::WidgetAttribute MacSizes[] = { Qt::WA_MacNormalSize, Qt::WA_MacSmallSize,
                                                     Qt::WA_MacMiniSize };
            for (int i = 0; i < 3; ++i) {
                if (MacSizes[i] != attribute)
                    setAttribute_internal(MacSizes[i], false, data, d);
            }
            d->macUpdateSizeAttribute();
        }
#endif
        break;
    case Qt::WA_ShowModal:
        if (!on) {
            // reset modality type to NonModal when clearing WA_ShowModal
            data->window_modality = Qt::NonModal;
        } else if (data->window_modality == Qt::NonModal) {
            // If modality hasn't been set prior to setting WA_ShowModal, use
            // ApplicationModal.
            data->window_modality = Qt::ApplicationModal;
            // Some window managers do not allow us to enter modality after the
            // window is visible.The window must be hidden before changing the
            // windowModality property and then reshown.
        }
        if (testAttribute(Qt::WA_WState_Created)) {
            // don't call setModal_sys() before create()
            d->setModal_sys();
        }
        break;
    case Qt::WA_MouseTracking: {
        QEvent e(QEvent::MouseTrackingChange);
        QCoreApplication::sendEvent(this, &e);
        break; }
    case Qt::WA_TabletTracking: {
        QEvent e(QEvent::TabletTrackingChange);
        QCoreApplication::sendEvent(this, &e);
        break; }
    case Qt::WA_NativeWindow: {
        d->createTLExtra();
        if (on)
            d->createTLSysExtra();
#ifndef QT_NO_IM
        QWidget *focusWidget = d->effectiveFocusWidget();
        if (on && !internalWinId() && this == QGuiApplication::focusObject()
            && focusWidget->testAttribute(Qt::WA_InputMethodEnabled)) {
            QGuiApplication::inputMethod()->commit();
            QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        }
        if (!QCoreApplication::testAttribute(Qt::AA_DontCreateNativeWidgetSiblings) && parentWidget())
            parentWidget()->d_func()->enforceNativeChildren();
        if (on && !internalWinId() && testAttribute(Qt::WA_WState_Created))
            d->createWinId();
        if (isEnabled() && focusWidget->isEnabled() && this == QGuiApplication::focusObject()
            && focusWidget->testAttribute(Qt::WA_InputMethodEnabled)) {
            QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        }
#endif //QT_NO_IM
        break;
    }
    case Qt::WA_PaintOnScreen:
        d->updateIsOpaque();
        Q_FALLTHROUGH();
    case Qt::WA_OpaquePaintEvent:
        d->updateIsOpaque();
        break;
    case Qt::WA_NoSystemBackground:
        d->updateIsOpaque();
        Q_FALLTHROUGH();
    case Qt::WA_UpdatesDisabled:
        d->updateSystemBackground();
        break;
    case Qt::WA_TransparentForMouseEvents:
        break;
    case Qt::WA_InputMethodEnabled: {
#ifndef QT_NO_IM
        if (QGuiApplication::focusObject() == this) {
            if (!on)
                QGuiApplication::inputMethod()->commit();
            QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        }
#endif //QT_NO_IM
        break;
    }
    case Qt::WA_WindowPropagation:
        d->resolvePalette();
        d->resolveFont();
        d->resolveLocale();
        break;
    case Qt::WA_DontShowOnScreen: {
        if (on && isVisible()) {
            // Make sure we keep the current state and only hide the widget
            // from the desktop. show_sys will only update platform specific
            // attributes at this point.
            d->hide_sys();
            d->show_sys();
        }
        break;
    }

    case Qt::WA_X11NetWmWindowTypeDesktop:
    case Qt::WA_X11NetWmWindowTypeDock:
    case Qt::WA_X11NetWmWindowTypeToolBar:
    case Qt::WA_X11NetWmWindowTypeMenu:
    case Qt::WA_X11NetWmWindowTypeUtility:
    case Qt::WA_X11NetWmWindowTypeSplash:
    case Qt::WA_X11NetWmWindowTypeDialog:
    case Qt::WA_X11NetWmWindowTypeDropDownMenu:
    case Qt::WA_X11NetWmWindowTypePopupMenu:
    case Qt::WA_X11NetWmWindowTypeToolTip:
    case Qt::WA_X11NetWmWindowTypeNotification:
    case Qt::WA_X11NetWmWindowTypeCombo:
    case Qt::WA_X11NetWmWindowTypeDND:
        d->setNetWmWindowTypes();
        break;

    case Qt::WA_StaticContents:
        if (QWidgetRepaintManager *repaintManager = d->maybeRepaintManager()) {
            if (on)
                repaintManager->addStaticWidget(this);
            else
                repaintManager->removeStaticWidget(this);
        }
        break;
    case Qt::WA_TranslucentBackground:
        if (on)
            setAttribute(Qt::WA_NoSystemBackground);
        d->updateIsTranslucent();

        break;
    case Qt::WA_AcceptTouchEvents:
        break;
    default:
        break;
    }
}